

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O2

char * __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,char *__s,int __c)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pEVar6;
  pointer pEVar7;
  int iVar8;
  
  uVar2 = 0xffffffffffffffff;
  uVar5 = uVar2;
  if (this->m_used != 0) {
    iVar3 = (*this->m_hashfun)((Name *)__s);
    pEVar6 = (this->m_elem).data.
             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar7 = (this->m_elem).data.
             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = (long)iVar3 % (long)(int)(((long)pEVar7 - (long)pEVar6) / 0x18);
    iVar3 = (int)uVar1;
    do {
      iVar8 = (int)uVar1;
      if (*(states *)((long)(pEVar6 + iVar8) + 0x10) == USED) {
        iVar4 = soplex::operator==(&pEVar6[iVar8].item,(Name *)__s);
        uVar5 = uVar1 & 0xffffffff;
        if (iVar4 != 0) break;
        pEVar6 = (this->m_elem).data.
                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar7 = (this->m_elem).data.
                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        uVar5 = uVar2;
        if (*(states *)((long)(pEVar6 + iVar8) + 0x10) == FREE) break;
      }
      uVar1 = (long)(iVar8 + this->m_hashsize) % (long)(int)(((long)pEVar7 - (long)pEVar6) / 0x18);
      uVar5 = uVar2;
    } while ((int)uVar1 != iVar3);
  }
  return (char *)(uVar5 & 0xffffffff);
}

Assistant:

int index(const HashItem& h) const
   {
      if(m_used == 0)
         return -1;

      assert(m_elem.size() > 0);

      auto i = (*m_hashfun)(&h) % m_elem.size();
      auto j = i;

      while(m_elem[i].stat != Elem::FREE)
      {
         if((m_elem[i].stat == Elem::USED)
               && (m_elem[i].item == h))
            return i;

         i = (i + m_hashsize) % m_elem.size();

         if(i == j)
            break;
      }

      return -1;
   }